

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<Resource,_8UL>::~SmallVector(SmallVector<Resource,_8UL> *this)

{
  Resource *pRVar1;
  Resource *pRVar2;
  SmallVector<Resource,_8UL> *this_local;
  
  clear(this);
  pRVar1 = (this->super_VectorView<Resource>).ptr;
  pRVar2 = AlignedBuffer<Resource,_8UL>::data(&this->stack_storage);
  if (pRVar1 != pRVar2) {
    free((this->super_VectorView<Resource>).ptr);
  }
  return;
}

Assistant:

~SmallVector()
	{
		clear();
		if (this->ptr != stack_storage.data())
			free(this->ptr);
	}